

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void newcheckedkey(Table *t,TValue *key,TValue *value)

{
  long lVar1;
  long lVar2;
  lu_byte lVar3;
  lu_byte lVar4;
  undefined2 uVar5;
  int iVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  long lVar10;
  Node *pNVar11;
  Node *unaff_R13;
  Value VStack_38;
  lu_byte lStack_30;
  
  iVar6 = 0;
  if ((key->tt_ == '\x03') &&
     (iVar6 = (int)(key->value_).i, (ulong)t->asize <= (key->value_).i - 1U)) {
    iVar6 = 0;
  }
  if (iVar6 != 0) {
    *(lu_byte *)((long)t->array + (ulong)(iVar6 - 1) + 4) = value->tt_;
    t->array[-1 - (ulong)(iVar6 - 1)] = value->value_;
    return;
  }
  pNVar7 = mainpositionTV(t,key);
  if ((((pNVar7->u).tt_ & 0xf) != 0) || ((t->flags & 0x40) != 0)) {
    if (t->lsizenode < 3) {
      lVar10 = (1L << (t->lsizenode & 0x3f)) * 0x18 + -0x18;
      do {
        lVar1 = lVar10 + -0x18;
        pNVar11 = unaff_R13;
        if (lVar1 == -0x30) break;
        lVar2 = lVar10 + 9;
        pNVar11 = (Node *)((long)t->node + lVar10);
        lVar10 = lVar1;
      } while (*(char *)((long)t->node + lVar2) != '\0');
      if (lVar1 == -0x30) {
LAB_0011b35a:
        pNVar11 = (Node *)0x0;
      }
    }
    else {
      do {
        pNVar8 = t->node;
        pNVar9 = *(Node **)((long)pNVar8 - 8);
        if (pNVar9 <= pNVar8) goto LAB_0011b35a;
        pNVar11 = pNVar9 + -1;
        *(Node **)((long)pNVar8 - 8) = pNVar11;
      } while (*(char *)((long)pNVar9 - 0xf) != '\0');
    }
    if (pNVar11 != (Node *)0x0) {
      VStack_38 = (pNVar7->u).key_val;
      lStack_30 = (pNVar7->u).key_tt;
      pNVar8 = mainpositionTV(t,(TValue *)&VStack_38);
      if (pNVar8 == pNVar7) {
        if ((long)(pNVar7->u).next != 0) {
          (pNVar11->u).next =
               (int)((ulong)((long)pNVar7 + ((long)(pNVar7->u).next * 0x18 - (long)pNVar11)) >> 3) *
               -0x55555555;
        }
        (pNVar7->u).next = (int)((ulong)((long)pNVar11 - (long)pNVar7) >> 3) * -0x55555555;
        pNVar7 = pNVar11;
      }
      else {
        do {
          pNVar9 = pNVar8;
          pNVar8 = pNVar9 + (pNVar9->u).next;
        } while (pNVar9 + (pNVar9->u).next != pNVar7);
        (pNVar9->u).next = (int)((ulong)((long)pNVar11 - (long)pNVar9) >> 3) * -0x55555555;
        (pNVar11->u).key_val = (pNVar7->u).key_val;
        lVar3 = *(lu_byte *)((long)pNVar7 + 8);
        lVar4 = *(lu_byte *)((long)pNVar7 + 9);
        uVar5 = *(undefined2 *)((long)pNVar7 + 10);
        iVar6 = *(int *)((long)pNVar7 + 0xc);
        (pNVar11->u).value_ = (pNVar7->u).value_;
        *(lu_byte *)((long)pNVar11 + 8) = lVar3;
        *(lu_byte *)((long)pNVar11 + 9) = lVar4;
        *(undefined2 *)((long)pNVar11 + 10) = uVar5;
        *(int *)((long)pNVar11 + 0xc) = iVar6;
        if ((pNVar7->u).next != 0) {
          (pNVar11->u).next =
               (pNVar11->u).next + (int)((ulong)((long)pNVar7 - (long)pNVar11) >> 3) * -0x55555555;
          (pNVar7->u).next = 0;
        }
        (pNVar7->u).tt_ = '\x10';
      }
    }
    if (pNVar11 == (Node *)0x0) {
      return;
    }
  }
  (pNVar7->u).key_val = key->value_;
  (pNVar7->u).key_tt = key->tt_;
  (pNVar7->u).value_ = value->value_;
  (pNVar7->u).tt_ = value->tt_;
  return;
}

Assistant:

static void newcheckedkey (Table *t, const TValue *key, TValue *value) {
  unsigned i = keyinarray(t, key);
  if (i > 0)  /* is key in the array part? */
    obj2arr(t, i - 1, value);  /* set value in the array */
  else {
    int done = insertkey(t, key, value);  /* insert key in the hash part */
    lua_assert(done);  /* it cannot fail */
    cast(void, done);  /* to avoid warnings */
  }
}